

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_php.cpp
# Opt level: O3

void __thiscall
flatbuffers::php::PhpGenerator::GenStruct(PhpGenerator *this,StructDef *struct_def,string *code_ptr)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  byte bVar3;
  long *plVar4;
  Parser *pPVar5;
  pointer ppFVar6;
  long *plVar7;
  size_type *psVar8;
  string *code;
  pointer ppFVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if ((struct_def->super_Definition).generated == false) {
    GenComment(&(struct_def->super_Definition).doc_comment,code_ptr,(CommentConfig *)0x0,"");
    BeginClass(struct_def,code_ptr);
    bVar3 = struct_def->fixed;
    if ((bool)bVar3 == false) {
      NewRootTypeFromBuffer(struct_def,code_ptr);
      bVar3 = struct_def->fixed;
    }
    if ((bVar3 & 1) == 0) {
      pPVar5 = (this->super_BaseGenerator).parser_;
      if ((pPVar5->file_identifier_)._M_string_length != 0) {
        paVar1 = &local_70.field_2;
        local_70._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_70,Indent_abi_cxx11_,DAT_003ebcb0 + Indent_abi_cxx11_);
        std::__cxx11::string::append((char *)&local_70);
        plVar4 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_70,
                                    (ulong)(struct_def->super_Definition).name._M_dataplus._M_p);
        plVar7 = plVar4 + 2;
        if ((long *)*plVar4 == plVar7) {
          local_80 = *plVar7;
          lStack_78 = plVar4[3];
          local_90 = &local_80;
        }
        else {
          local_80 = *plVar7;
          local_90 = (long *)*plVar4;
        }
        local_88 = plVar4[1];
        *plVar4 = (long)plVar7;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_90);
        if (local_90 != &local_80) {
          operator_delete(local_90,local_80 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != paVar1) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::string::append((char *)code_ptr);
        local_90 = &local_80;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_90,Indent_abi_cxx11_,DAT_003ebcb0 + Indent_abi_cxx11_);
        std::__cxx11::string::append((char *)&local_90);
        std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_90);
        if (local_90 != &local_80) {
          operator_delete(local_90,local_80 + 1);
        }
        std::operator+(&local_70,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &Indent_abi_cxx11_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &Indent_abi_cxx11_);
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_70);
        plVar7 = plVar4 + 2;
        if ((long *)*plVar4 == plVar7) {
          local_80 = *plVar7;
          lStack_78 = plVar4[3];
          local_90 = &local_80;
        }
        else {
          local_80 = *plVar7;
          local_90 = (long *)*plVar4;
        }
        local_88 = plVar4[1];
        *plVar4 = (long)plVar7;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_90);
        if (local_90 != &local_80) {
          operator_delete(local_90,local_80 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != paVar1) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        pPVar5 = (this->super_BaseGenerator).parser_;
        pcVar2 = (pPVar5->file_identifier_)._M_dataplus._M_p;
        local_90 = &local_80;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_90,pcVar2,pcVar2 + (pPVar5->file_identifier_)._M_string_length);
        std::__cxx11::string::append((char *)&local_90);
        std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_90);
        if (local_90 != &local_80) {
          operator_delete(local_90,local_80 + 1);
        }
        local_90 = &local_80;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_90,Indent_abi_cxx11_,DAT_003ebcb0 + Indent_abi_cxx11_);
        std::__cxx11::string::append((char *)&local_90);
        std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_90);
        if (local_90 != &local_80) {
          operator_delete(local_90,local_80 + 1);
        }
        local_70._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_70,Indent_abi_cxx11_,DAT_003ebcb0 + Indent_abi_cxx11_);
        std::__cxx11::string::append((char *)&local_70);
        plVar4 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_70,
                                    (ulong)(struct_def->super_Definition).name._M_dataplus._M_p);
        plVar7 = plVar4 + 2;
        if ((long *)*plVar4 == plVar7) {
          local_80 = *plVar7;
          lStack_78 = plVar4[3];
          local_90 = &local_80;
        }
        else {
          local_80 = *plVar7;
          local_90 = (long *)*plVar4;
        }
        local_88 = plVar4[1];
        *plVar4 = (long)plVar7;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_90);
        if (local_90 != &local_80) {
          operator_delete(local_90,local_80 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != paVar1) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::string::append((char *)code_ptr);
        local_90 = &local_80;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_90,Indent_abi_cxx11_,DAT_003ebcb0 + Indent_abi_cxx11_);
        std::__cxx11::string::append((char *)&local_90);
        std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_90);
        if (local_90 != &local_80) {
          operator_delete(local_90,local_80 + 1);
        }
        std::operator+(&local_70,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &Indent_abi_cxx11_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &Indent_abi_cxx11_);
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_70);
        plVar7 = plVar4 + 2;
        if ((long *)*plVar4 == plVar7) {
          local_80 = *plVar7;
          lStack_78 = plVar4[3];
          local_90 = &local_80;
        }
        else {
          local_80 = *plVar7;
          local_90 = (long *)*plVar4;
        }
        local_88 = plVar4[1];
        *plVar4 = (long)plVar7;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_90);
        if (local_90 != &local_80) {
          operator_delete(local_90,local_80 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != paVar1) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::string::append((char *)code_ptr);
        pcVar2 = (struct_def->super_Definition).name._M_dataplus._M_p;
        local_90 = &local_80;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_90,pcVar2,
                   pcVar2 + (struct_def->super_Definition).name._M_string_length);
        std::__cxx11::string::append((char *)&local_90);
        std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_90);
        if (local_90 != &local_80) {
          operator_delete(local_90,local_80 + 1);
        }
        local_90 = &local_80;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_90,Indent_abi_cxx11_,DAT_003ebcb0 + Indent_abi_cxx11_);
        std::__cxx11::string::append((char *)&local_90);
        std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_90);
        if (local_90 != &local_80) {
          operator_delete(local_90,local_80 + 1);
        }
        pPVar5 = (this->super_BaseGenerator).parser_;
      }
      if ((pPVar5->file_extension_)._M_string_length != 0) {
        paVar1 = &local_70.field_2;
        local_70._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_70,Indent_abi_cxx11_,DAT_003ebcb0 + Indent_abi_cxx11_);
        std::__cxx11::string::append((char *)&local_70);
        plVar4 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_70,
                                    (ulong)(struct_def->super_Definition).name._M_dataplus._M_p);
        plVar7 = plVar4 + 2;
        if ((long *)*plVar4 == plVar7) {
          local_80 = *plVar7;
          lStack_78 = plVar4[3];
          local_90 = &local_80;
        }
        else {
          local_80 = *plVar7;
          local_90 = (long *)*plVar4;
        }
        local_88 = plVar4[1];
        *plVar4 = (long)plVar7;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_90);
        if (local_90 != &local_80) {
          operator_delete(local_90,local_80 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != paVar1) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::string::append((char *)code_ptr);
        local_90 = &local_80;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_90,Indent_abi_cxx11_,DAT_003ebcb0 + Indent_abi_cxx11_);
        std::__cxx11::string::append((char *)&local_90);
        std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_90);
        if (local_90 != &local_80) {
          operator_delete(local_90,local_80 + 1);
        }
        std::operator+(&local_50,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &Indent_abi_cxx11_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &Indent_abi_cxx11_);
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
        psVar8 = (size_type *)(plVar4 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar4 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar8) {
          local_70.field_2._M_allocated_capacity = *psVar8;
          local_70.field_2._8_8_ = plVar4[3];
          local_70._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_70.field_2._M_allocated_capacity = *psVar8;
          local_70._M_dataplus._M_p = (pointer)*plVar4;
        }
        local_70._M_string_length = plVar4[1];
        *plVar4 = (long)psVar8;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        plVar4 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_70,
                                    (ulong)(((this->super_BaseGenerator).parser_)->file_extension_).
                                           _M_dataplus._M_p);
        plVar7 = plVar4 + 2;
        if ((long *)*plVar4 == plVar7) {
          local_80 = *plVar7;
          lStack_78 = plVar4[3];
          local_90 = &local_80;
        }
        else {
          local_80 = *plVar7;
          local_90 = (long *)*plVar4;
        }
        local_88 = plVar4[1];
        *plVar4 = (long)plVar7;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_90);
        if (local_90 != &local_80) {
          operator_delete(local_90,local_80 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != paVar1) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::string::append((char *)code_ptr);
        local_90 = &local_80;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_90,Indent_abi_cxx11_,DAT_003ebcb0 + Indent_abi_cxx11_);
        std::__cxx11::string::append((char *)&local_90);
        std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_90);
        if (local_90 != &local_80) {
          operator_delete(local_90,local_80 + 1);
        }
      }
    }
    InitializeExisting(struct_def,code_ptr);
    ppFVar6 = (struct_def->fields).vec.
              super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    for (ppFVar9 = (struct_def->fields).vec.
                   super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                   ._M_impl.super__Vector_impl_data._M_start; ppFVar9 != ppFVar6;
        ppFVar9 = ppFVar9 + 1) {
      if ((*ppFVar9)->deprecated == false) {
        GenStructAccessor(this,struct_def,*ppFVar9,code_ptr);
        ppFVar6 = (struct_def->fields).vec.
                  super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
    }
    if (struct_def->fixed == false) {
      GenTableBuilders(this,struct_def,code_ptr);
    }
    else {
      GenStructBuilder(struct_def,code_ptr);
    }
    std::__cxx11::string::append((char *)code_ptr);
  }
  return;
}

Assistant:

void GenStruct(const StructDef &struct_def, std::string *code_ptr) {
    if (struct_def.generated) return;

    GenComment(struct_def.doc_comment, code_ptr, nullptr);
    BeginClass(struct_def, code_ptr);

    if (!struct_def.fixed) {
      // Generate a special accessor for the table that has been declared as
      // the root type.
      NewRootTypeFromBuffer(struct_def, code_ptr);
    }

    std::string &code = *code_ptr;
    if (!struct_def.fixed) {
      if (parser_.file_identifier_.length()) {
        // Return the identifier
        code += Indent + "public static function " + struct_def.name;
        code += "Identifier()\n";
        code += Indent + "{\n";
        code += Indent + Indent + "return \"";
        code += parser_.file_identifier_ + "\";\n";
        code += Indent + "}\n\n";

        // Check if a buffer has the identifier.
        code += Indent + "public static function " + struct_def.name;
        code += "BufferHasIdentifier(ByteBuffer $buf)\n";
        code += Indent + "{\n";
        code += Indent + Indent + "return self::";
        code += "__has_identifier($buf, self::";
        code += struct_def.name + "Identifier());\n";
        code += Indent + "}\n\n";
      }

      if (parser_.file_extension_.length()) {
        // Return the extension
        code += Indent + "public static function " + struct_def.name;
        code += "Extension()\n";
        code += Indent + "{\n";
        code += Indent + Indent + "return \"" + parser_.file_extension_;
        code += "\";\n";
        code += Indent + "}\n\n";
      }
    }

    // Generate the Init method that sets the field in a pre-existing
    // accessor object. This is to allow object reuse.
    InitializeExisting(struct_def, code_ptr);
    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      auto &field = **it;
      if (field.deprecated) continue;

      GenStructAccessor(struct_def, field, code_ptr);
    }

    if (struct_def.fixed) {
      // create a struct constructor function
      GenStructBuilder(struct_def, code_ptr);
    } else {
      // Create a set of functions that allow table construction.
      GenTableBuilders(struct_def, code_ptr);
    }
    EndClass(code_ptr);
  }